

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataTangents
          (MeshGeometry *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *tangents_out,Scope *source
          ,string *MappingInformationType,string *ReferenceInformationType)

{
  size_type sVar1;
  size_type sVar2;
  char *indexDataElementName;
  char *dataElementName;
  allocator<char> local_59;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_58;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Tangents",&local_59);
  local_58 = tangents_out;
  sVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                   *)source,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  dataElementName = "Tangents";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Tangents",&local_59);
  sVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                   *)source,&local_50);
  if (sVar1 == 0) {
    dataElementName = "Tangent";
  }
  indexDataElementName = "TangentsIndex";
  if (sVar2 == 0) {
    indexDataElementName = "TangentIndex";
  }
  std::__cxx11::string::~string((string *)&local_50);
  ResolveVertexDataArray<aiVector3t<float>>
            (local_58,source,MappingInformationType,ReferenceInformationType,dataElementName,
             indexDataElementName,
             ((long)(this->m_vertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vertices).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xc,&this->m_mapping_counts,
             &this->m_mapping_offsets,&this->m_mappings);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataTangents(std::vector<aiVector3D>& tangents_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    const char * str = source.Elements().count( "Tangents" ) > 0 ? "Tangents" : "Tangent";
    const char * strIdx = source.Elements().count( "Tangents" ) > 0 ? TangentsIndexToken : TangentIndexToken;
    ResolveVertexDataArray(tangents_out,source,MappingInformationType,ReferenceInformationType,
        str,
        strIdx,
        m_vertices.size(),
        m_mapping_counts,
        m_mapping_offsets,
        m_mappings);
}